

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall wasm::TranslateToFuzzReader::makeSIMDLoad(TranslateToFuzzReader *this)

{
  Random *this_00;
  int8_t iVar1;
  SIMDLoadOp op;
  Index IVar2;
  int iVar3;
  Expression *ptr;
  SIMDLoad *pSVar4;
  Address offset;
  Address align;
  
  this_00 = &this->random;
  align.addr = 0;
  op = Random::
       pick<wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp>
                 (this_00,Load8SplatVec128,Load16SplatVec128,Load32SplatVec128,Load64SplatVec128,
                  Load8x8SVec128,Load8x8UVec128,Load16x4SVec128,Load16x4UVec128,Load32x2SVec128,
                  Load32x2UVec128);
  iVar1 = Random::get(this_00);
  IVar2 = logify(this,(int)iVar1);
  switch(op) {
  case Load8SplatVec128:
    align.addr = 1;
    goto switchD_00158852_default;
  case Load16SplatVec128:
    iVar3 = Random::pick<int,int>(this_00,1,2);
    break;
  case Load32SplatVec128:
    iVar3 = Random::pick<int,int,int>(this_00,1,2,4);
    break;
  case Load64SplatVec128:
  case Load8x8SVec128:
  case Load8x8UVec128:
  case Load16x4SVec128:
  case Load16x4UVec128:
  case Load32x2SVec128:
  case Load32x2UVec128:
    iVar3 = Random::pick<int,int,int,int>(this_00,1,2,4,8);
    break;
  case Load32ZeroVec128:
  case Load64ZeroVec128:
    ::wasm::handle_unreachable
              ("Unexpected SIMD loads",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0xc2d);
  default:
    goto switchD_00158852_default;
  }
  align.addr = (address64_t)iVar3;
switchD_00158852_default:
  offset.addr._4_4_ = 0;
  offset.addr._0_4_ = IVar2;
  ptr = makePointer(this);
  pSVar4 = Builder::makeSIMDLoad
                     (&this->builder,op,offset,align,ptr,
                      (Name)*(string_view *)
                             (((this->wasm->memories).
                               super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                             super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                     );
  return (Expression *)pSVar4;
}

Assistant:

Expression* TranslateToFuzzReader::makeSIMDLoad() {
  // TODO: add Load{32,64}Zero if merged to proposal
  SIMDLoadOp op = pick(Load8SplatVec128,
                       Load16SplatVec128,
                       Load32SplatVec128,
                       Load64SplatVec128,
                       Load8x8SVec128,
                       Load8x8UVec128,
                       Load16x4SVec128,
                       Load16x4UVec128,
                       Load32x2SVec128,
                       Load32x2UVec128);
  Address offset = logify(get());
  Address align;
  switch (op) {
    case Load8SplatVec128:
      align = 1;
      break;
    case Load16SplatVec128:
      align = pick(1, 2);
      break;
    case Load32SplatVec128:
      align = pick(1, 2, 4);
      break;
    case Load64SplatVec128:
    case Load8x8SVec128:
    case Load8x8UVec128:
    case Load16x4SVec128:
    case Load16x4UVec128:
    case Load32x2SVec128:
    case Load32x2UVec128:
      align = pick(1, 2, 4, 8);
      break;
    case Load32ZeroVec128:
    case Load64ZeroVec128:
      WASM_UNREACHABLE("Unexpected SIMD loads");
  }
  Expression* ptr = makePointer();
  return builder.makeSIMDLoad(op, offset, align, ptr, wasm.memories[0]->name);
}